

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint getPaletteTranslucency(uchar *palette,size_t palettesize)

{
  uchar uVar1;
  uchar uVar2;
  uint b;
  uint g;
  uint r;
  uint key;
  size_t i;
  size_t palettesize_local;
  uchar *palette_local;
  
  g = 0;
  b = 0;
  uVar1 = '\0';
  uVar2 = '\0';
  _r = 0;
  do {
    if (_r == palettesize) {
      return g;
    }
    if ((g == 0) && (palette[_r * 4 + 3] == '\0')) {
      b = (uint)palette[_r * 4];
      uVar1 = palette[_r * 4 + 1];
      uVar2 = palette[_r * 4 + 2];
      g = 1;
      _r = 0xffffffffffffffff;
    }
    else {
      if (palette[_r * 4 + 3] != 0xff) {
        return 2;
      }
      if ((((g != 0) && (b == palette[_r * 4])) && (uVar1 == palette[_r * 4 + 1])) &&
         (uVar2 == palette[_r * 4 + 2])) {
        return 2;
      }
    }
    _r = _r + 1;
  } while( true );
}

Assistant:

static unsigned getPaletteTranslucency(const unsigned char* palette, size_t palettesize)
{
  size_t i;
  unsigned key = 0;
  unsigned r = 0, g = 0, b = 0; /*the value of the color with alpha 0, so long as color keying is possible*/
  for(i = 0; i != palettesize; ++i)
  {
    if(!key && palette[4 * i + 3] == 0)
    {
      r = palette[4 * i + 0]; g = palette[4 * i + 1]; b = palette[4 * i + 2];
      key = 1;
      i = (size_t)(-1); /*restart from beginning, to detect earlier opaque colors with key's value*/
    }
    else if(palette[4 * i + 3] != 255) return 2;
    /*when key, no opaque RGB may have key's RGB*/
    else if(key && r == palette[i * 4 + 0] && g == palette[i * 4 + 1] && b == palette[i * 4 + 2]) return 2;
  }
  return key;
}